

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticquad.cpp
# Opt level: O2

void pzgeom::TPZQuadraticQuad::TShape<double>
               (TPZVec<double> *par,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar12 = SUB168(*(undefined1 (*) [16])par->fStore,0);
  dVar13 = SUB168(*(undefined1 (*) [16])par->fStore,8);
  dVar1 = dVar13 + -1.0;
  dVar7 = dVar12 + -1.0;
  dVar11 = dVar13 + 1.0;
  pdVar6 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar6 = (dVar12 + dVar11) * dVar7 * dVar1 * -0.25;
  dVar8 = dVar12 + 1.0;
  pdVar6 = TPZFMatrix<double>::operator()(phi,1,0);
  *pdVar6 = (dVar11 - dVar12) * dVar1 * 0.25 * dVar8;
  pdVar6 = TPZFMatrix<double>::operator()(phi,2,0);
  *pdVar6 = (dVar12 + dVar13 + -1.0) * dVar8 * 0.25 * dVar11;
  pdVar6 = TPZFMatrix<double>::operator()(phi,3,0);
  *pdVar6 = (dVar1 - dVar12) * dVar11 * -0.25 * dVar7;
  pdVar6 = TPZFMatrix<double>::operator()(phi,4,0);
  *pdVar6 = dVar7 * dVar1 * 0.5 * dVar8;
  dVar2 = dVar1 * -0.5 * dVar11;
  pdVar6 = TPZFMatrix<double>::operator()(phi,5,0);
  *pdVar6 = dVar8 * dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(phi,6,0);
  *pdVar6 = dVar11 * -0.5 * dVar7 * dVar8;
  dVar3 = dVar1 * 0.5 * dVar11;
  pdVar6 = TPZFMatrix<double>::operator()(phi,7,0);
  *pdVar6 = dVar7 * dVar3;
  dVar9 = dVar12 + dVar12 + dVar13;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,0,0);
  *pdVar6 = dVar1 * -0.25 * dVar9;
  dVar4 = dVar13 + dVar13 + dVar12;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,1,0);
  *pdVar6 = dVar7 * -0.25 * dVar4;
  dVar10 = dVar13 - (dVar12 + dVar12);
  pdVar6 = TPZFMatrix<double>::operator()(dphi,0,1);
  *pdVar6 = dVar1 * 0.25 * dVar10;
  dVar5 = (dVar13 + dVar13) - dVar12;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,1,1);
  *pdVar6 = dVar5 * 0.25 * dVar8;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,0,2);
  *pdVar6 = dVar11 * 0.25 * dVar9;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,1,2);
  *pdVar6 = dVar4 * dVar8 * 0.25;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,0,3);
  *pdVar6 = dVar10 * dVar11 * -0.25;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,1,3);
  *pdVar6 = dVar5 * -0.25 * dVar7;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,0,4);
  *pdVar6 = dVar1 * dVar12;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,1,4);
  *pdVar6 = dVar7 * 0.5 * dVar8;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,0,5);
  *pdVar6 = dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,1,5);
  *pdVar6 = -dVar13 * dVar8;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,0,6);
  *pdVar6 = -dVar11 * dVar12;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,1,6);
  *pdVar6 = dVar7 * -0.5 * dVar8;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,0,7);
  *pdVar6 = dVar3;
  pdVar6 = TPZFMatrix<double>::operator()(dphi,1,7);
  *pdVar6 = dVar7 * dVar13;
  return;
}

Assistant:

void TPZQuadraticQuad::TShape(const TPZVec<T> &par,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
	T qsi = par[0], eta = par[1];
	
	phi(0,0)  = -0.25*(-1. + eta)*(-1. + qsi)*(1. + eta + qsi);
	phi(1,0)  =  0.25*(-1. + eta)*(1. + eta - qsi)*(1. + qsi);
	phi(2,0)  =  0.25*( 1. + qsi)*(1. + eta)*(qsi + eta - 1.);
	phi(3,0)  = -0.25*( 1. + eta)*(-1. + eta - qsi)*(-1. + qsi);
	
	phi(4,0)  =  0.5*(-1. + eta)*(-1. + qsi)*( 1. + qsi);
	phi(5,0)  = -0.5*(-1. + eta)*( 1. + eta)*( 1. + qsi);
	phi(6,0)  = -0.5*( 1. + eta)*(-1. + qsi)*( 1. + qsi);
	phi(7,0)  =  0.5*(-1. + eta)*( 1. + eta)*(-1. + qsi);
	
	dphi(0,0) = -0.25*(-1. + eta)*(eta + 2.*qsi);
	dphi(1,0) = -0.25*(-1. + qsi)*(2.*eta + qsi);
	dphi(0,1) =  0.25*(-1. + eta)*(eta - 2.*qsi);
	dphi(1,1) =  0.25*(2.*eta - qsi)*(1. + qsi);
	dphi(0,2) =  0.25*(1. + eta)*(eta + 2.*qsi);
	dphi(1,2) =  0.25*(1. + qsi)*(2.*eta + qsi);
	dphi(0,3) = -0.25*(1. + eta)*(eta - 2.*qsi);
	dphi(1,3) = -0.25*(2.*eta - qsi)*(-1. + qsi);
	
	dphi(0,4) =  (-1. + eta)*qsi;
	dphi(1,4) =  0.5*(-1. + qsi)*(1. + qsi);
	dphi(0,5) = -0.5*(-1. + eta)*(1. + eta);
	dphi(1,5) = -eta*(1. + qsi);
	dphi(0,6) = -(1. + eta)*qsi;
	dphi(1,6) = -0.5*(-1. + qsi)*(1. + qsi);
	dphi(0,7) =  0.5*(-1. + eta)*(1. + eta);
	dphi(1,7) =  eta*(-1. + qsi);
}